

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O1

void polymul_internal::taylor_inplace_multiplier<double,_3,_4,_4,_0>::mul(double *p1,double *p2)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar1 = binomial(6,3);
  iVar2 = binomial(7,4);
  if (iVar1 < iVar2) {
    lVar3 = (long)iVar1;
    do {
      p1[lVar3] = *p2 * p1[lVar3];
      lVar3 = lVar3 + 1;
      iVar1 = binomial(7,4);
    } while (lVar3 < iVar1);
  }
  taylor_inplace_multiplier<double,_3,_4,_4,_1>::mul(p1,p2);
  return;
}

Assistant:

static void mul(numtype POLYMUL_RESTRICT p1[], const numtype p2[]) {
    for (int i = binomial(Nvar + Ndeg - 1, Ndeg - 1);
         i < binomial(Nvar + Ndeg, Ndeg);
         i++)
      p1[i] *= p2[0];
    taylor_inplace_multiplier<numtype, Nvar, Ndeg, Ndeg2, 1>::mul(
        p1, p2); // continue at (2)
  }